

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaNormalTargetGenerator::WriteDeviceLinkRules
          (cmNinjaNormalTargetGenerator *this,string *config)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  undefined8 uVar1;
  TargetType targetType;
  int iVar2;
  cmLocalNinjaGenerator *pcVar3;
  string *psVar4;
  cmGlobalNinjaGenerator *pcVar5;
  cmGeneratorTarget *pcVar6;
  cmMakefile *this_00;
  undefined4 extraout_var;
  pointer this_01;
  string *local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7c0;
  cmOutputConverter *local_790;
  string *local_6e8;
  string local_698;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_672;
  undefined1 local_671;
  cmAlphaNum local_670;
  allocator<char> local_639;
  string local_638;
  cmAlphaNum local_618;
  string *local_5e8;
  string local_5e0;
  iterator local_5c0;
  size_type local_5b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5b0;
  string local_598;
  string local_578;
  string local_558;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_531;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  iterator local_508;
  size_type local_500;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4f8;
  string local_4e0;
  string local_4c0;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_> local_4a0;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string local_490;
  undefined1 local_470 [8];
  string compileCmd;
  allocator<char> local_429;
  string local_428;
  undefined1 local_408 [8];
  string flags;
  RuleVariables vars;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_272;
  undefined1 local_271;
  cmAlphaNum local_270;
  allocator<char> local_239;
  string local_238;
  cmAlphaNum local_218;
  string *local_1e8;
  string local_1e0;
  iterator local_1c0;
  size_type local_1b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b0;
  string local_198;
  string local_168;
  undefined1 local_148 [8];
  cmNinjaRule rule;
  cmMakefile *mf;
  string *config_local;
  cmNinjaNormalTargetGenerator *this_local;
  
  rule._288_8_ = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
  LanguageLinkerCudaDeviceRule(&local_168,this,config);
  cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_148,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  pcVar3 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  uVar1 = rule._288_8_;
  local_271 = 1;
  local_1e8 = &local_1e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"CMAKE_CUDA_DEVICE_LINKER",&local_239);
  psVar4 = cmMakefile::GetRequiredDefinition((cmMakefile *)uVar1,&local_238);
  cmAlphaNum::cmAlphaNum(&local_218,psVar4);
  cmAlphaNum::cmAlphaNum(&local_270," -arch=$ARCH $REGISTER -o=$out $in");
  cmStrCat<>(&local_1e0,&local_218,&local_270);
  local_271 = 0;
  local_1c0 = &local_1e0;
  local_1b8 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_272);
  __l_01._M_len = local_1b8;
  __l_01._M_array = local_1c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1b0,__l_01,&local_272);
  std::__cxx11::string::string((string *)&vars.Launcher);
  cmLocalNinjaGenerator::BuildCommandLine
            (&local_198,pcVar3,&local_1b0,config,config,(string *)&vars.Launcher,
             (cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=
            ((string *)(rule.Name.field_2._M_local_buf + 8),(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&vars.Launcher);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_272);
  local_6e8 = (string *)&local_1c0;
  do {
    local_6e8 = local_6e8 + -1;
    std::__cxx11::string::~string((string *)local_6e8);
  } while (local_6e8 != &local_1e0);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  std::__cxx11::string::operator=
            ((string *)(rule.Description.field_2._M_local_buf + 8),"Rule for CUDA device linking.");
  std::__cxx11::string::operator=
            ((string *)(rule.Command.field_2._M_local_buf + 8),"Linking CUDA $out");
  pcVar5 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddRule(pcVar5,(cmNinjaRule *)local_148);
  cmRulePlaceholderExpander::RuleVariables::RuleVariables
            ((RuleVariables *)((long)&flags.field_2 + 8));
  pcVar6 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  cmGeneratorTarget::GetName_abi_cxx11_(pcVar6);
  flags.field_2._8_8_ = std::__cxx11::string::c_str();
  pcVar6 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  targetType = cmGeneratorTarget::GetType(pcVar6);
  cmState::GetTargetTypeName_abi_cxx11_(targetType);
  vars.CMTargetName = (char *)std::__cxx11::string::c_str();
  vars.TargetVersionMinor = "CUDA";
  vars.Output = "$out";
  vars.CudaCompileMode = "$FATBIN";
  vars.Fatbinary = "$REGISTER";
  vars.TargetInstallNameDir = "$LINK_FLAGS";
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,"CUDA",&local_429);
  std::__cxx11::string::string((string *)(compileCmd.field_2._M_local_buf + 8));
  cmCommonTargetGenerator::GetFlags
            ((string *)local_408,(cmCommonTargetGenerator *)this,&local_428,config,
             (string *)(compileCmd.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(compileCmd.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator(&local_429);
  vars.ObjectFileDir = (char *)std::__cxx11::string::c_str();
  this_00 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_490,"CMAKE_CUDA_DEVICE_LINK_COMPILE",
             (allocator<char> *)
             ((long)&rulePlaceholderExpander._M_t.
                     super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                     .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl + 7));
  psVar4 = cmMakefile::GetRequiredDefinition(this_00,&local_490);
  std::__cxx11::string::string((string *)local_470,(string *)psVar4);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&rulePlaceholderExpander._M_t.
                     super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                     .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl + 7));
  pcVar3 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  iVar2 = (*(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[5])
                    ();
  std::unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>>::
  unique_ptr<std::default_delete<cmRulePlaceholderExpander>,void>
            ((unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>> *
             )&local_4a0,(pointer)CONCAT44(extraout_var,iVar2));
  this_01 = std::
            unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
            operator->(&local_4a0);
  pcVar3 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  local_790 = (cmOutputConverter *)0x0;
  if (pcVar3 != (cmLocalNinjaGenerator *)0x0) {
    local_790 = &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                 super_cmOutputConverter;
  }
  cmRulePlaceholderExpander::ExpandRuleVariables
            (this_01,local_790,(string *)local_470,(RuleVariables *)((long)&flags.field_2 + 8));
  LanguageLinkerCudaDeviceCompileRule(&local_4c0,this,config);
  std::__cxx11::string::operator=((string *)local_148,(string *)&local_4c0);
  std::__cxx11::string::~string((string *)&local_4c0);
  pcVar3 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  local_530 = &local_528;
  std::__cxx11::string::string((string *)local_530,(string *)local_470);
  local_508 = &local_528;
  local_500 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_531);
  __l_00._M_len = local_500;
  __l_00._M_array = local_508;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_4f8,__l_00,&local_531);
  std::__cxx11::string::string((string *)&local_558);
  cmLocalNinjaGenerator::BuildCommandLine
            (&local_4e0,pcVar3,&local_4f8,config,config,&local_558,(cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=
            ((string *)(rule.Name.field_2._M_local_buf + 8),(string *)&local_4e0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::__cxx11::string::~string((string *)&local_558);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4f8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_531);
  local_7c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_508;
  do {
    local_7c0 = local_7c0 + -1;
    std::__cxx11::string::~string((string *)local_7c0);
  } while (local_7c0 != &local_528);
  std::__cxx11::string::operator=
            ((string *)(rule.Description.field_2._M_local_buf + 8),
             "Rule for compiling CUDA device stubs.");
  std::__cxx11::string::operator=
            ((string *)(rule.Command.field_2._M_local_buf + 8),"Compiling CUDA device stub $out");
  pcVar5 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddRule(pcVar5,(cmNinjaRule *)local_148);
  LanguageLinkerCudaFatbinaryRule(&local_578,this,config);
  std::__cxx11::string::operator=((string *)local_148,(string *)&local_578);
  std::__cxx11::string::~string((string *)&local_578);
  pcVar3 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  uVar1 = rule._288_8_;
  local_671 = 1;
  local_5e8 = &local_5e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_638,"CMAKE_CUDA_FATBINARY",&local_639);
  psVar4 = cmMakefile::GetRequiredDefinition((cmMakefile *)uVar1,&local_638);
  cmAlphaNum::cmAlphaNum(&local_618,psVar4);
  cmAlphaNum::cmAlphaNum
            (&local_670,
             " -64 -cmdline=--compile-only -compress-all -link --embedded-fatbin=$out $PROFILES");
  cmStrCat<>(&local_5e0,&local_618,&local_670);
  local_671 = 0;
  local_5c0 = &local_5e0;
  local_5b8 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_672);
  __l._M_len = local_5b8;
  __l._M_array = local_5c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_5b0,__l,&local_672);
  std::__cxx11::string::string((string *)&local_698);
  cmLocalNinjaGenerator::BuildCommandLine
            (&local_598,pcVar3,&local_5b0,config,config,&local_698,(cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=
            ((string *)(rule.Name.field_2._M_local_buf + 8),(string *)&local_598);
  std::__cxx11::string::~string((string *)&local_598);
  std::__cxx11::string::~string((string *)&local_698);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5b0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_672);
  local_820 = (string *)&local_5c0;
  do {
    local_820 = local_820 + -1;
    std::__cxx11::string::~string((string *)local_820);
  } while (local_820 != &local_5e0);
  std::__cxx11::string::~string((string *)&local_638);
  std::allocator<char>::~allocator(&local_639);
  std::__cxx11::string::operator=
            ((string *)(rule.Description.field_2._M_local_buf + 8),"Rule for CUDA fatbinaries.");
  std::__cxx11::string::operator=
            ((string *)(rule.Command.field_2._M_local_buf + 8),"Creating fatbinary $out");
  pcVar5 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::AddRule(pcVar5,(cmNinjaRule *)local_148);
  std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
  ~unique_ptr(&local_4a0);
  std::__cxx11::string::~string((string *)local_470);
  std::__cxx11::string::~string((string *)local_408);
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_148);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteDeviceLinkRules(
  const std::string& config)
{
  const cmMakefile* mf = this->GetMakefile();

  cmNinjaRule rule(this->LanguageLinkerCudaDeviceRule(config));
  rule.Command = this->GetLocalGenerator()->BuildCommandLine(
    { cmStrCat(mf->GetRequiredDefinition("CMAKE_CUDA_DEVICE_LINKER"),
               " -arch=$ARCH $REGISTER -o=$out $in") },
    config, config);
  rule.Comment = "Rule for CUDA device linking.";
  rule.Description = "Linking CUDA $out";
  this->GetGlobalGenerator()->AddRule(rule);

  cmRulePlaceholderExpander::RuleVariables vars;
  vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
  vars.CMTargetType =
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType()).c_str();

  vars.Language = "CUDA";
  vars.Object = "$out";
  vars.Fatbinary = "$FATBIN";
  vars.RegisterFile = "$REGISTER";
  vars.LinkFlags = "$LINK_FLAGS";

  std::string flags = this->GetFlags("CUDA", config);
  vars.Flags = flags.c_str();

  std::string compileCmd = this->GetMakefile()->GetRequiredDefinition(
    "CMAKE_CUDA_DEVICE_LINK_COMPILE");
  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->GetLocalGenerator()->CreateRulePlaceholderExpander());
  rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                               compileCmd, vars);

  rule.Name = this->LanguageLinkerCudaDeviceCompileRule(config);
  rule.Command = this->GetLocalGenerator()->BuildCommandLine({ compileCmd },
                                                             config, config);
  rule.Comment = "Rule for compiling CUDA device stubs.";
  rule.Description = "Compiling CUDA device stub $out";
  this->GetGlobalGenerator()->AddRule(rule);

  rule.Name = this->LanguageLinkerCudaFatbinaryRule(config);
  rule.Command = this->GetLocalGenerator()->BuildCommandLine(
    { cmStrCat(mf->GetRequiredDefinition("CMAKE_CUDA_FATBINARY"),
               " -64 -cmdline=--compile-only -compress-all -link "
               "--embedded-fatbin=$out $PROFILES") },
    config, config);
  rule.Comment = "Rule for CUDA fatbinaries.";
  rule.Description = "Creating fatbinary $out";
  this->GetGlobalGenerator()->AddRule(rule);
}